

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertproxymodel.cpp
# Opt level: O3

QMap<int,_QVariant> __thiscall InsertProxyModel::itemData(InsertProxyModel *this,QModelIndex *index)

{
  int iVar1;
  int iVar2;
  QAbstractItemModel *pQVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long *plVar7;
  long *plVar8;
  int *piVar9;
  byte bVar10;
  int *in_RDX;
  byte bVar11;
  long local_60 [6];
  
  if ((((-1 < *in_RDX) && (-1 < in_RDX[1])) && (*(long *)(in_RDX + 4) != 0)) &&
     (lVar6 = QAbstractProxyModel::sourceModel(), lVar6 != 0)) {
    plVar7 = (long *)QAbstractProxyModel::sourceModel();
    local_60[0] = -1;
    local_60[1] = 0;
    local_60[2] = 0;
    iVar4 = (**(code **)(*plVar7 + 0x78))(plVar7,local_60);
    plVar7 = (long *)QAbstractProxyModel::sourceModel();
    local_60[0] = -1;
    local_60[1] = 0;
    local_60[2] = 0;
    iVar5 = (**(code **)(*plVar7 + 0x80))(plVar7,local_60);
    pQVar3 = index->m;
    if (*(long **)(in_RDX + 4) == (long *)0x0) {
      local_60[0] = -1;
      local_60[1] = 0;
      local_60[2] = 0;
    }
    else {
      (**(code **)(**(long **)(in_RDX + 4) + 0x68))(local_60);
      if (((-1 < (int)local_60[0]) && (-1 < local_60[0])) && (local_60[2] != 0)) goto LAB_00141a44;
    }
    iVar1 = *in_RDX;
    if (((iVar1 <= iVar4) && (iVar2 = in_RDX[1], iVar2 <= iVar5)) &&
       (((iVar1 != iVar4 || (((byte)*pQVar3 & 1) != 0)) &&
        ((iVar2 != iVar5 || (((byte)*pQVar3 & 2) != 0)))))) {
      if (iVar1 == iVar4) {
        bVar10 = (byte)*pQVar3 & 1;
      }
      else {
        bVar10 = 0;
      }
      if (iVar2 == iVar5) {
        bVar11 = ((byte)*pQVar3 & 2) >> 1;
      }
      else {
        bVar11 = 0;
      }
      if (bVar10 != 0 || bVar11 != 0) {
        if ((bVar11 & bVar10) == 1) {
          piVar9 = *(int **)(pQVar3 + 0xa8);
        }
        else {
          if (bVar10 != 0) {
            iVar1 = iVar2;
          }
          piVar9 = *(int **)(*(long *)(pQVar3 + (ulong)bVar10 * 0x18 + 0x70) + (long)iVar1 * 8);
        }
        *(int **)this = piVar9;
        if (piVar9 == (int *)0x0) {
          return (QMap<int,_QVariant>)
                 (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                  )this;
        }
        LOCK();
        *piVar9 = *piVar9 + 1;
        UNLOCK();
        return (QMap<int,_QVariant>)
               (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                )this;
      }
      plVar7 = (long *)QAbstractProxyModel::sourceModel();
      plVar8 = (long *)QAbstractProxyModel::sourceModel();
      local_60[3] = 0xffffffffffffffff;
      local_60[4] = 0;
      local_60[5] = 0;
      (**(code **)(*plVar8 + 0x60))(local_60,plVar8,*in_RDX,in_RDX[1]);
      (**(code **)(*plVar7 + 0xb0))(this,plVar7,local_60);
      return (QMap<int,_QVariant>)
             (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
              )this;
    }
  }
LAB_00141a44:
  *(undefined8 *)this = 0;
  return (QMap<int,_QVariant>)
         (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
          )this;
}

Assistant:

QMap<int, QVariant> InsertProxyModel::itemData(const QModelIndex &index) const
{
    if (!index.isValid())
        return QMap<int, QVariant>();
    if (!sourceModel())
        return QMap<int, QVariant>();
    const int sourceRows = sourceModel()->rowCount();
    const int sourceCols = sourceModel()->columnCount();
    Q_D(const InsertProxyModel);
    if (index.parent().isValid() || index.row() > sourceRows || index.column() > sourceCols
        || (index.row() == sourceRows && !(d->m_insertDirection & InsertRow))
        || (index.column() == sourceCols && !(d->m_insertDirection & InsertColumn)))
        return QMap<int, QVariant>();
    const bool isExtraRow = index.row() == sourceRows && d->m_insertDirection & InsertRow;
    const bool isExtraCol = index.column() == sourceCols && d->m_insertDirection & InsertColumn;
    if (!(isExtraRow || isExtraCol))
        return sourceModel()->itemData(sourceModel()->index(index.row(), index.column()));
    if (isExtraRow && isExtraCol)
        return convertFromContainer<QMap<int, QVariant>>(d->m_dataForCorner);
    const int sectionIdx = isExtraRow ? index.column() : index.row();
    return convertFromContainer<QMap<int, QVariant>>(d->m_extraData[isExtraRow][sectionIdx]);
}